

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest2.cpp
# Opt level: O2

void __thiscall UdpSocketTest::handleData(UdpSocketTest *this,Socket *s)

{
  uint uVar1;
  undefined8 in_RAX;
  undefined4 uStack_18;
  uint32_t num;
  
  _uStack_18 = in_RAX;
  uVar1 = (**(code **)(*(long *)s + 0x18))(s,&num,4);
  if (uVar1 != 4) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x142,"Read Failed %d",(ulong)uVar1);
  }
  _uStack_18 = CONCAT44(num + 1,uStack_18);
  uVar1 = (**(code **)(*(long *)s + 0x20))(s,&num,4);
  if (uVar1 != 4) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x148,"Write Failed %d",(ulong)uVar1);
  }
  return;
}

Assistant:

void UdpSocketTest::handleData( Socket *s )
{
  
	LOG_NOTICE( "called" );
	uint32_t num;
	
	int res = s->read( &num, 4 );
	
	if ( res != 4 )
		TestFailed( "Read Failed %d", res );

	num += 1;
	res = s->write( &num, 4 );

	if ( res != 4 )
		TestFailed( "Write Failed %d", res );

}